

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUnitTest++.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_374d6::TestCheckThrowMacroFailsOnMissingException::
~TestCheckThrowMacroFailsOnMissingException(TestCheckThrowMacroFailsOnMissingException *this)

{
  TestCheckThrowMacroFailsOnMissingException *this_local;
  
  ~TestCheckThrowMacroFailsOnMissingException(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckThrowMacroFailsOnMissingException)
{
    class NoThrowTest : public UnitTest::Test
    {
    public:
        NoThrowTest() : Test("nothrow") {}
        void DontThrow() const
        {
        }

        virtual void RunImpl() const
        {
            CHECK_THROW(DontThrow(), int);
        }
    };

    UnitTest::TestResults results;
	{
		ScopedCurrentTest scopedResults(results);

		NoThrowTest test;
		test.Run();
	}

	CHECK_EQUAL(1, results.GetFailureCount());
}